

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O0

void __thiscall
node::BlockAssembler::BlockAssembler
          (BlockAssembler *this,Chainstate *chainstate,CTxMemPool *mempool,Options *options)

{
  long lVar1;
  Options options_00;
  undefined8 *puVar2;
  CChainParams *pCVar3;
  byte *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long lVar4;
  long in_FS_OFFSET;
  ChainstateManager *in_stack_ffffffffffffff28;
  undefined8 local_a0;
  long lVar5;
  undefined8 in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = in_RDI;
  std::unique_ptr<node::CBlockTemplate,std::default_delete<node::CBlockTemplate>>::
  unique_ptr<std::default_delete<node::CBlockTemplate>,void>
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             in_stack_ffffffffffffff28);
  lVar4 = lVar5 + 0x28;
  std::
  unordered_set<transaction_identifier<false>,_SaltedTxidHasher,_std::equal_to<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::unordered_set((unordered_set<transaction_identifier<false>,_SaltedTxidHasher,_std::equal_to<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)in_stack_ffffffffffffff28);
  puVar2 = (undefined8 *)(in_RDI + 0x80);
  pCVar3 = ChainstateManager::GetParams(in_stack_ffffffffffffff28);
  *puVar2 = pCVar3;
  local_a0 = in_RDX;
  if ((*in_RCX & 1) == 0) {
    local_a0 = 0;
  }
  *(undefined8 *)(in_RDI + 0x88) = local_a0;
  *(undefined8 *)(in_RDI + 0x90) = in_RSI;
  options_00.super_BlockCreateOptions.coinbase_max_additional_weight = (size_t)pCVar3;
  options_00.super_BlockCreateOptions._0_8_ = puVar2;
  options_00.super_BlockCreateOptions.coinbase_output_max_additional_sigops = in_RDI;
  options_00.nBlockMaxWeight = lVar5;
  options_00.blockMinFeeRate.nSatoshisPerK = lVar4;
  options_00.test_block_validity = (bool)(char)in_stack_ffffffffffffff98;
  options_00.print_modified_fee = (bool)(char)((ulong)in_stack_ffffffffffffff98 >> 8);
  options_00._42_6_ = (int6)((ulong)in_stack_ffffffffffffff98 >> 0x10);
  ClampOptions(options_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BlockAssembler::BlockAssembler(Chainstate& chainstate, const CTxMemPool* mempool, const Options& options)
    : chainparams{chainstate.m_chainman.GetParams()},
      m_mempool{options.use_mempool ? mempool : nullptr},
      m_chainstate{chainstate},
      m_options{ClampOptions(options)}
{
}